

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O2

void __thiscall
wasm::StringifyWalker<TestStringifyWalker>::addUniqueSymbol
          (StringifyWalker<TestStringifyWalker> *this,SeparatorReason reason)

{
  ostream *poVar1;
  byte in_SIL;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)
                           this[1].
                           super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                           .
                           super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                           .replacep,"adding unique symbol for ");
  if (in_SIL < 8) {
    pcVar2 = &DAT_002528e4 + *(int *)(&DAT_002528e4 + (ulong)in_SIL * 4);
  }
  else {
    pcVar2 = "~~~Undefined in operator<< overload~~~";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

inline void StringifyWalker<SubType>::addUniqueSymbol(SeparatorReason reason) {
  // TODO: Add the following static_assert when the compilers running our GitHub
  // actions are updated enough to know that this is a constant condition:
  // static_assert(&StringifyWalker<SubType>::addUniqueSymbol !=
  // &SubType::addUniqueSymbol);
  auto self = static_cast<SubType*>(this);
  self->addUniqueSymbol(reason);
}